

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void sexp_define_accessors
               (sexp_conflict ctx,sexp_conflict env,sexp_uint_t ctype,sexp_uint_t cindex,char *get,
               char *set)

{
  long lVar1;
  long lVar2;
  sexp_conflict op;
  sexp_conflict name;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &name;
  name = (sexp_conflict)0x43e;
  local_40.var = &op;
  op = (sexp_conflict)0x43e;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  lVar1 = ctype * 2 + 1;
  lVar2 = cindex * 2 + 1;
  if (get != (char *)0x0) {
    name = (sexp_conflict)sexp_c_string(ctx,get,0xffffffffffffffff);
    op = (sexp_conflict)sexp_make_getter_op(ctx,0,3,name,lVar1,lVar2);
    name = (sexp_conflict)sexp_intern(ctx,get,0xffffffffffffffff);
    sexp_env_define(ctx,env,name,op);
  }
  if (set != (char *)0x0) {
    name = (sexp_conflict)sexp_c_string(ctx,set,0xffffffffffffffff);
    op = (sexp_conflict)sexp_make_setter_op(ctx,0,3,name,lVar1,lVar2);
    name = (sexp_conflict)sexp_intern(ctx,set,0xffffffffffffffff);
    sexp_env_define(ctx,env,name,op);
  }
  (ctx->value).context.saves = local_50.next;
  return;
}

Assistant:

static void sexp_define_accessors (sexp ctx, sexp env, sexp_uint_t ctype,
                                   sexp_uint_t cindex,
                                   const char* get, const char *set) {
  sexp type, index;
  sexp_gc_var2(name, op);
  sexp_gc_preserve2(ctx, name, op);
  type = sexp_make_fixnum(ctype);
  index = sexp_make_fixnum(cindex);
  if (get) {
    op = sexp_make_getter(ctx, name=sexp_c_string(ctx, get, -1), type, index);
    sexp_env_define(ctx, env, name=sexp_intern(ctx, get, -1), op);
  }
  if (set) {
    op = sexp_make_setter(ctx, name=sexp_c_string(ctx, set, -1), type, index);
    sexp_env_define(ctx, env, name=sexp_intern(ctx, set, -1), op);
  }
  sexp_gc_release2(ctx);
}